

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
::_reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
          *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
  *pCVar1;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>_>
  *targetColumn;
  undefined4 uVar2;
  pointer puVar3;
  iterator __position;
  ID_index IVar4;
  Column_dimension_option CVar5;
  ID_index IVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  _List_node_base *p_Var12;
  iterator iVar13;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
  *pCVar14;
  Column *col;
  pointer puVar15;
  uint *puVar16;
  undefined8 *puVar17;
  pointer p_1;
  undefined8 *puVar18;
  long *plVar19;
  pointer p;
  pointer p_4;
  pointer p_3;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>_>
  *source;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainsInH;
  Tmp_column column;
  _List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> local_b8;
  uint local_ac;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
  *local_a8;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_a0;
  ulong local_98;
  uint local_90;
  anon_class_1_0_00000001 local_8b;
  anon_class_1_0_00000001 local_8a;
  anon_class_1_0_00000001 local_89;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
  *local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  local_a8 = this;
  local_90 = cellID;
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_60,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  puVar3 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar15 = (boundary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_98 = (ulong)(uint)dim;
  if (dim == -1) {
    if (puVar3 == puVar15) {
      local_98 = 0;
    }
    else {
      local_98 = (ulong)((int)((ulong)((long)puVar15 - (long)puVar3) >> 2) - 1);
    }
  }
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = (vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__;
  if (puVar3 == puVar15) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_60,&local_90);
    pCVar14 = local_a8;
    uVar2 = *(undefined4 *)(local_a8 + 0xd8);
    local_b8._M_node._0_4_ = (int)local_98;
    lVar10 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    uVar8 = *(uint *)(lVar10 + 0x20);
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>>>
    ::
    emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::Column_z2_settings*&>
              ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>>>
                *)(pCVar14 + 0xa8),
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &local_60,(int *)&local_b8,(Column_z2_settings **)(pCVar14 + 0xe0));
    *(undefined4 *)(*(long *)(pCVar14 + 0xc0) + (ulong)uVar8 * 4) = uVar2;
    p_Var12 = (_List_node_base *)operator_new(0x20);
    pCVar1 = pCVar14 + 0x70;
    uVar2 = *(undefined4 *)(pCVar14 + 0x70);
    *(int *)&p_Var12[1]._M_next = (int)local_98;
    *(undefined4 *)((long)&p_Var12[1]._M_next + 4) = uVar2;
    *(undefined4 *)&p_Var12[1]._M_prev = 0xffffffff;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    *(long *)(pCVar14 + 0x30) = *(long *)(pCVar14 + 0x30) + 1;
    local_b8._M_node = *(_List_node_base **)(pCVar14 + 0x28);
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(pCVar14 + 0x38),(const_iterator)0x0,(uint *)pCVar1,&local_b8);
    pCVar14 = pCVar14 + 0xd8;
    *(uint *)pCVar1 = *(uint *)pCVar1 + 1;
  }
  else {
    lVar10 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    pCVar1 = local_a8;
    local_68 = local_a8 + 0xa8;
    lVar10 = (ulong)*(uint *)(*(long *)(local_a8 + 0xc0) + (ulong)*(uint *)(lVar10 + 0x20) * 4) *
             0x30;
    uVar8 = *(uint *)(*(long *)(local_a8 + 0xa8) + 8 + lVar10);
    if (uVar8 == 0xffffffff) goto LAB_001138f2;
    lVar10 = *(long *)(local_a8 + 0xa8) + lVar10;
    do {
      plVar19 = *(long **)(lVar10 + 0x20);
      if (plVar19 != (long *)(lVar10 + 0x20)) {
        do {
          if (plVar19 == (long *)0x0) goto LAB_00113b47;
          local_b8._M_node._0_4_ = (int)plVar19[2];
          pVar20 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_60,(_Base_ptr)pVar20.first._M_node);
          }
          plVar19 = (long *)*plVar19;
        } while (plVar19 != (long *)(lVar10 + 0x20));
        uVar8 = *(uint *)(lVar10 + 8);
      }
      local_b8._M_node._0_4_ = uVar8;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_b8);
      }
      else {
        *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar8;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
        local_ac = local_90;
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_60,&local_ac);
        puVar3 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          puVar15 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          do {
            puVar17 = (undefined8 *)(*(long *)local_68 + (ulong)*puVar15 * 0x30 + 0x20);
            for (puVar18 = (undefined8 *)*puVar17; puVar18 != puVar17;
                puVar18 = (undefined8 *)*puVar18) {
              if (puVar18 == (undefined8 *)0x0) goto LAB_00113b47;
              local_b8._M_node._0_4_ = *(undefined4 *)(puVar18 + 2);
              pVar20 = std::
                       _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
              if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                    *)&local_60,(_Base_ptr)pVar20.first._M_node);
              }
            }
            puVar15 = puVar15 + 1;
          } while (puVar15 != puVar3);
        }
        pCVar1 = local_a8;
        uVar2 = *(undefined4 *)(local_a8 + 0xd8);
        local_b8._M_node._0_4_ = (int)local_98;
        lVar10 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
        uVar8 = *(uint *)(lVar10 + 0x20);
        std::
        vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>>>
        ::
        emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::Column_z2_settings*&>
                  ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>>>
                    *)local_68,
                   (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &local_60,(int *)&local_b8,(Column_z2_settings **)(pCVar1 + 0xe0));
        *(undefined4 *)(*(long *)(local_a8 + 0xc0) + (ulong)uVar8 * 4) = uVar2;
        p_Var12 = (_List_node_base *)operator_new(0x20);
        pCVar14 = local_a8;
        pCVar1 = local_a8 + 0x70;
        uVar2 = *(undefined4 *)(local_a8 + 0x70);
        *(int *)&p_Var12[1]._M_next = (int)local_98;
        *(undefined4 *)((long)&p_Var12[1]._M_next + 4) = uVar2;
        *(undefined4 *)&p_Var12[1]._M_prev = 0xffffffff;
        std::__detail::_List_node_base::_M_hook(p_Var12);
        *(long *)(pCVar14 + 0x30) = *(long *)(pCVar14 + 0x30) + 1;
        local_b8._M_node = *(_List_node_base **)(pCVar14 + 0x28);
        std::__detail::
        _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
                  ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)(pCVar14 + 0x38),(const_iterator)0x0,(uint *)pCVar1,&local_b8);
        pCVar14 = local_a8 + 0xd8;
        *(uint *)pCVar1 = *(uint *)pCVar1 + 1;
        goto LAB_00113b0d;
      }
      lVar10 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
      lVar11 = (ulong)*(uint *)(*(long *)(pCVar1 + 0xc0) + (ulong)*(uint *)(lVar10 + 0x20) * 4) *
               0x30;
      lVar10 = *(long *)(pCVar1 + 0xa8) + lVar11;
      uVar8 = *(uint *)(*(long *)(pCVar1 + 0xa8) + 8 + lVar11);
    } while (uVar8 != 0xffffffff);
    do {
      lVar11 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
      lVar10 = *(long *)(pCVar1 + 0xa8);
      uVar8 = *(uint *)(*(long *)(pCVar1 + 0xc0) + (ulong)*(uint *)(lVar11 + 0x20) * 4);
      lVar11 = (ulong)uVar8 * 0x30;
      uVar9 = *(uint *)(lVar10 + 8 + lVar11);
      if (uVar9 == 0xffffffff) {
        puVar17 = (undefined8 *)(lVar10 + lVar11 + 0x20);
        local_ac = uVar8;
        for (puVar18 = (undefined8 *)*puVar17; puVar18 != puVar17; puVar18 = (undefined8 *)*puVar18)
        {
          if (puVar18 == (undefined8 *)0x0) goto LAB_00113b47;
          local_b8._M_node._0_4_ = *(undefined4 *)(puVar18 + 2);
          pVar20 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_60,(_Base_ptr)pVar20.first._M_node);
          }
        }
        __position._M_current = *(uint **)(local_a0 + 8);
        if (__position._M_current == *(uint **)(local_a0 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(local_a0,__position,&local_ac);
        }
        else {
          *__position._M_current = local_ac;
          *(uint **)(local_a0 + 8) = __position._M_current + 1;
        }
      }
      else {
        lVar10 = lVar10 + lVar11;
        plVar19 = *(long **)(lVar10 + 0x20);
        if (plVar19 != (long *)(lVar10 + 0x20)) {
          do {
            if (plVar19 == (long *)0x0) goto LAB_00113b47;
            local_b8._M_node._0_4_ = (int)plVar19[2];
            pVar20 = std::
                     _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
            if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                  *)&local_60,(_Base_ptr)pVar20.first._M_node);
            }
            plVar19 = (long *)*plVar19;
          } while (plVar19 != (long *)(lVar10 + 0x20));
          uVar9 = *(uint *)(lVar10 + 8);
        }
        local_b8._M_node._0_4_ = uVar9;
        if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b8);
        }
        else {
          *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar9;
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
LAB_001138f2:
    } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
    puVar16 = *(uint **)local_a0 + 1;
    if (puVar16 != *(uint **)(local_a0 + 8)) {
      lVar10 = (ulong)**(uint **)local_a0 * 0x30;
      do {
        lVar11 = *(long *)local_68;
        targetColumn = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>_>
                        *)(lVar11 + lVar10);
        uVar8 = *(uint *)(lVar11 + 4 + lVar10);
        source = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>_>
                  *)((ulong)*puVar16 * 0x30 + lVar11);
        local_b8._M_node = (_List_node_base *)targetColumn;
        bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::pe___udhi::persistence_matrix::Column_types)7,true,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                          (source,targetColumn,(anon_class_1_0_00000001 *)&local_ac,
                           (anon_class_8_1_e4bd5e45 *)&local_b8,&local_89,&local_8a,&local_8b);
        if (bVar7) {
          CVar5.dim_ = (targetColumn->super_Column_dimension_option).dim_;
          IVar6 = (targetColumn->super_Chain_column_option).pivot_;
          IVar4 = (source->super_Chain_column_option).pivot_;
          targetColumn->super_Column_dimension_option =
               (Column_dimension_option)(source->super_Column_dimension_option).dim_;
          (targetColumn->super_Chain_column_option).pivot_ = IVar4;
          source->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
          (source->super_Chain_column_option).pivot_ = IVar6;
        }
        uVar9 = (targetColumn->super_Chain_column_option).pivot_;
        if (uVar8 != uVar9) {
          lVar11 = *(long *)(pCVar1 + 0xc0);
          uVar2 = *(undefined4 *)(lVar11 + (ulong)uVar8 * 4);
          *(undefined4 *)(lVar11 + (ulong)uVar8 * 4) = *(undefined4 *)(lVar11 + (ulong)uVar9 * 4);
          *(undefined4 *)(lVar11 + (ulong)uVar9 * 4) = uVar2;
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 != *(uint **)(local_a0 + 8));
    }
    local_ac = local_90;
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_60,&local_ac);
    puVar3 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar15 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        puVar17 = (undefined8 *)(*(long *)local_68 + (ulong)*puVar15 * 0x30 + 0x20);
        for (puVar18 = (undefined8 *)*puVar17; puVar18 != puVar17; puVar18 = (undefined8 *)*puVar18)
        {
          if (puVar18 == (undefined8 *)0x0) {
LAB_00113b47:
            __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                          "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Chain_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, false, true>>::Matrix_column_tag, Type = 1]"
                         );
          }
          local_b8._M_node._0_4_ = *(undefined4 *)(puVar18 + 2);
          pVar20 = std::
                   _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::_M_insert_unique<unsigned_int>(&local_60,(uint *)&local_b8);
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                *)&local_60,(_Base_ptr)pVar20.first._M_node);
          }
        }
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar3);
    }
    pCVar1 = local_a8;
    uVar8 = **(uint **)local_a0;
    uVar2 = *(undefined4 *)(local_a8 + 0xd8);
    local_b8._M_node._0_4_ = (int)local_98;
    lVar10 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    uVar9 = *(uint *)(lVar10 + 0x20);
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>>>
    ::
    emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::Column_z2_settings*&>
              ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>>>
                *)local_68,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &local_60,(int *)&local_b8,(Column_z2_settings **)(pCVar1 + 0xe0));
    *(undefined4 *)(*(long *)(local_a8 + 0xc0) + (ulong)uVar9 * 4) = uVar2;
    uVar9 = *(uint *)(local_a8 + 0xd8);
    lVar10 = *(long *)(local_a8 + 0xa8);
    *(uint *)(lVar10 + 8 + (ulong)uVar9 * 0x30) = uVar8;
    *(uint *)(lVar10 + 8 + (ulong)uVar8 * 0x30) = uVar9;
    local_b8._M_node._0_4_ = uVar8;
    this_00 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(local_a8 + 0x38);
    iVar13 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(this_00,(key_type *)&local_b8);
    if (iVar13.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    pCVar1 = local_a8 + 0x70;
    *(undefined4 *)
     (*(long *)((long)iVar13.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                      ._M_cur + 0x10) + 0x18) = *(undefined4 *)(local_a8 + 0x70);
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
              ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this_00,(const_iterator)0x0,(uint *)pCVar1,
               (_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
                *)((long)iVar13.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>,_false>
                         ._M_cur + 0x10));
    pCVar14 = local_a8 + 0xd8;
    *(uint *)pCVar1 = *(uint *)pCVar1 + 1;
  }
LAB_00113b0d:
  *(int *)pCVar14 = *(int *)pCVar14 + 1;
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}